

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_s_unittest.cpp
# Opt level: O0

void __thiscall
VectorSUnitTest_erase_range_of_elements_Test::VectorSUnitTest_erase_range_of_elements_Test
          (VectorSUnitTest_erase_range_of_elements_Test *this)

{
  VectorSUnitTest_erase_range_of_elements_Test *this_local;
  
  VectorSUnitTest::VectorSUnitTest(&this->super_VectorSUnitTest);
  (this->super_VectorSUnitTest).super_Test._vptr_Test =
       (_func_int **)&PTR__VectorSUnitTest_erase_range_of_elements_Test_001d11a0;
  return;
}

Assistant:

TEST_F(VectorSUnitTest, erase_range_of_elements)
{
    vector_s<unsigned, 12> v{0u, 1u, 2u, 3u, 4u, 5u, 6u, 7u, 8u, 9u, 10u, 11u};
    EXPECT_EQ(12u, v.size());

    // Erase 3 elements from the beginning
    const auto it1 = v.erase(v.begin(), v.begin() +3);
    EXPECT_EQ(v.begin(), it1);
    EXPECT_EQ(3u, *it1);
    EXPECT_EQ(9u, v.size());
    EXPECT_EQ(3u, v[0]);
    EXPECT_EQ(4u, v[1]);
    EXPECT_EQ(5u, v[2]);
    EXPECT_EQ(6u, v[3]);
    EXPECT_EQ(7u, v[4]);
    EXPECT_EQ(8u, v[5]);
    EXPECT_EQ(9u, v[6]);
    EXPECT_EQ(10u, v[7]);
    EXPECT_EQ(11u, v[8]);

    // Erase 3 elements from the middle
    const auto it2 = v.erase(v.begin()+3, v.begin()+6);
    EXPECT_EQ(v.begin()+3, it2);
    EXPECT_EQ(9u, *it2);
    EXPECT_EQ(6u, v.size());
    EXPECT_EQ(3u, v[0]);
    EXPECT_EQ(4u, v[1]);
    EXPECT_EQ(5u, v[2]);
    EXPECT_EQ(9u, v[3]);
    EXPECT_EQ(10u, v[4]);
    EXPECT_EQ(11u, v[5]);

    // Erase 3 last element
    const auto it3 = v.erase(v.end()-3, v.end());
    EXPECT_EQ(v.end(), it3);
    EXPECT_EQ(3u, v.size());
    EXPECT_EQ(3u, v[0]);
    EXPECT_EQ(4u, v[1]);
    EXPECT_EQ(5u, v[2]);
}